

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void pugi::impl::anon_unknown_0::node_copy_contents
               (xml_node_struct *dn,xml_node_struct *sn,xml_allocator *shared_alloc)

{
  xml_attribute_struct *header;
  xml_attribute_struct *source_header;
  
  (anonymous_namespace)::node_copy_string<char*,unsigned_long>
            (&dn->name,&dn->header,0x20,sn->name,&sn->header,shared_alloc);
  (anonymous_namespace)::node_copy_string<char*,unsigned_long>
            (&dn->value,&dn->header,0x10,sn->value,&sn->header,shared_alloc);
  for (source_header = sn->first_attribute; source_header != (xml_attribute_struct *)0x0;
      source_header = source_header->next_attribute) {
    header = append_new_attribute(dn,*(xml_allocator **)((long)dn - (dn->header >> 8)));
    if (header != (xml_attribute_struct *)0x0) {
      (anonymous_namespace)::node_copy_string<char*,unsigned_long>
                (&header->name,&header->header,0x20,source_header->name,&source_header->header,
                 shared_alloc);
      (anonymous_namespace)::node_copy_string<char*,unsigned_long>
                (&header->value,&header->header,0x10,source_header->value,&source_header->header,
                 shared_alloc);
    }
  }
  return;
}

Assistant:

PUGI_IMPL_FN void node_copy_contents(xml_node_struct* dn, xml_node_struct* sn, xml_allocator* shared_alloc)
	{
		node_copy_string(dn->name, dn->header, xml_memory_page_name_allocated_mask, sn->name, sn->header, shared_alloc);
		node_copy_string(dn->value, dn->header, xml_memory_page_value_allocated_mask, sn->value, sn->header, shared_alloc);

		for (xml_attribute_struct* sa = sn->first_attribute; sa; sa = sa->next_attribute)
		{
			xml_attribute_struct* da = append_new_attribute(dn, get_allocator(dn));

			if (da)
			{
				node_copy_string(da->name, da->header, xml_memory_page_name_allocated_mask, sa->name, sa->header, shared_alloc);
				node_copy_string(da->value, da->header, xml_memory_page_value_allocated_mask, sa->value, sa->header, shared_alloc);
			}
		}
	}